

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void lodepng::lodepng_icc_cleanup(LodePNGICC *icc)

{
  lodepng_icc_curve_cleanup((LodePNGICCCurve *)0x13fbe5);
  lodepng_icc_curve_cleanup((LodePNGICCCurve *)0x13fbf9);
  lodepng_icc_curve_cleanup((LodePNGICCCurve *)0x13fc0d);
  return;
}

Assistant:

void lodepng_icc_cleanup(LodePNGICC* icc) {
  lodepng_icc_curve_cleanup(&icc->trc[0]);
  lodepng_icc_curve_cleanup(&icc->trc[1]);
  lodepng_icc_curve_cleanup(&icc->trc[2]);
}